

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::Builtins::registerStringMethods(Builtins *this)

{
  long *local_140;
  uint local_138;
  bool local_134 [4];
  shared_ptr<slang::ast::SystemSubroutine> local_130;
  shared_ptr<slang::ast::SystemSubroutine> local_120;
  shared_ptr<slang::ast::SystemSubroutine> local_110;
  shared_ptr<slang::ast::SystemSubroutine> local_100;
  shared_ptr<slang::ast::SystemSubroutine> local_f0;
  shared_ptr<slang::ast::SystemSubroutine> local_e0;
  shared_ptr<slang::ast::SystemSubroutine> local_d0;
  shared_ptr<slang::ast::SystemSubroutine> local_c0;
  shared_ptr<slang::ast::SystemSubroutine> local_b0;
  shared_ptr<slang::ast::SystemSubroutine> local_a0;
  shared_ptr<slang::ast::SystemSubroutine> local_90;
  shared_ptr<slang::ast::SystemSubroutine> local_80;
  shared_ptr<slang::ast::SystemSubroutine> local_70;
  shared_ptr<slang::ast::SystemSubroutine> local_60;
  shared_ptr<slang::ast::SystemSubroutine> local_50;
  shared_ptr<slang::ast::SystemSubroutine> local_40;
  shared_ptr<slang::ast::SystemSubroutine> local_30;
  shared_ptr<slang::ast::SystemSubroutine> local_20;
  
  std::make_unique<slang::ast::builtins::StringLenMethod,slang::ast::builtins::Builtins&>
            ((Builtins *)&local_140);
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringLenMethod,std::default_delete<slang::ast::builtins::StringLenMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (unique_ptr<slang::ast::builtins::StringLenMethod,_std::default_delete<slang::ast::builtins::StringLenMethod>_>
              *)&local_140);
  addSystemMethod(this,StringType,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_140 != (long *)0x0) {
    (**(code **)(*local_140 + 8))();
  }
  std::make_unique<slang::ast::builtins::StringPutcMethod,slang::ast::builtins::Builtins&>
            ((Builtins *)&local_140);
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringPutcMethod,std::default_delete<slang::ast::builtins::StringPutcMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_30,
             (unique_ptr<slang::ast::builtins::StringPutcMethod,_std::default_delete<slang::ast::builtins::StringPutcMethod>_>
              *)&local_140);
  addSystemMethod(this,StringType,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_140 != (long *)0x0) {
    (**(code **)(*local_140 + 8))();
  }
  std::make_unique<slang::ast::builtins::StringGetcMethod,slang::ast::builtins::Builtins&>
            ((Builtins *)&local_140);
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringGetcMethod,std::default_delete<slang::ast::builtins::StringGetcMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_40,
             (unique_ptr<slang::ast::builtins::StringGetcMethod,_std::default_delete<slang::ast::builtins::StringGetcMethod>_>
              *)&local_140);
  addSystemMethod(this,StringType,&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_140 != (long *)0x0) {
    (**(code **)(*local_140 + 8))();
  }
  local_134[0] = true;
  local_134[1] = true;
  local_134[2] = false;
  local_134[3] = false;
  local_138 = CONCAT31(local_138._1_3_,1);
  std::
  make_unique<slang::ast::builtins::StringUpperLowerMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName,bool>
            ((Builtins *)&local_140,(KnownSystemName *)this,local_134);
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringUpperLowerMethod,std::default_delete<slang::ast::builtins::StringUpperLowerMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_50,
             (unique_ptr<slang::ast::builtins::StringUpperLowerMethod,_std::default_delete<slang::ast::builtins::StringUpperLowerMethod>_>
              *)&local_140);
  addSystemMethod(this,StringType,&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_140 != (long *)0x0) {
    (**(code **)(*local_140 + 8))();
  }
  local_134[0] = true;
  local_134[1] = true;
  local_134[2] = false;
  local_134[3] = false;
  local_138 = local_138 & 0xffffff00;
  std::
  make_unique<slang::ast::builtins::StringUpperLowerMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName,bool>
            ((Builtins *)&local_140,(KnownSystemName *)this,local_134);
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringUpperLowerMethod,std::default_delete<slang::ast::builtins::StringUpperLowerMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_60,
             (unique_ptr<slang::ast::builtins::StringUpperLowerMethod,_std::default_delete<slang::ast::builtins::StringUpperLowerMethod>_>
              *)&local_140);
  addSystemMethod(this,StringType,&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_60.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_140 != (long *)0x0) {
    (**(code **)(*local_140 + 8))();
  }
  local_134[0] = true;
  local_134[1] = true;
  local_134[2] = false;
  local_134[3] = false;
  local_138 = local_138 & 0xffffff00;
  std::
  make_unique<slang::ast::builtins::StringCompareMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName,bool>
            ((Builtins *)&local_140,(KnownSystemName *)this,local_134);
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringCompareMethod,std::default_delete<slang::ast::builtins::StringCompareMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_70,
             (unique_ptr<slang::ast::builtins::StringCompareMethod,_std::default_delete<slang::ast::builtins::StringCompareMethod>_>
              *)&local_140);
  addSystemMethod(this,StringType,&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_70.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_140 != (long *)0x0) {
    (**(code **)(*local_140 + 8))();
  }
  local_134[0] = true;
  local_134[1] = true;
  local_134[2] = false;
  local_134[3] = false;
  local_138 = CONCAT31(local_138._1_3_,1);
  std::
  make_unique<slang::ast::builtins::StringCompareMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName,bool>
            ((Builtins *)&local_140,(KnownSystemName *)this,local_134);
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringCompareMethod,std::default_delete<slang::ast::builtins::StringCompareMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_80,
             (unique_ptr<slang::ast::builtins::StringCompareMethod,_std::default_delete<slang::ast::builtins::StringCompareMethod>_>
              *)&local_140);
  addSystemMethod(this,StringType,&local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_80.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_140 != (long *)0x0) {
    (**(code **)(*local_140 + 8))();
  }
  std::make_unique<slang::ast::builtins::StringSubstrMethod,slang::ast::builtins::Builtins&>
            ((Builtins *)&local_140);
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringSubstrMethod,std::default_delete<slang::ast::builtins::StringSubstrMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_90,
             (unique_ptr<slang::ast::builtins::StringSubstrMethod,_std::default_delete<slang::ast::builtins::StringSubstrMethod>_>
              *)&local_140);
  addSystemMethod(this,StringType,&local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_90.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_140 != (long *)0x0) {
    (**(code **)(*local_140 + 8))();
  }
  local_134[0] = true;
  local_134[1] = true;
  local_134[2] = false;
  local_134[3] = false;
  local_138 = 10;
  std::
  make_unique<slang::ast::builtins::StringAtoIMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName,int>
            ((Builtins *)&local_140,(KnownSystemName *)this,(int *)local_134);
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringAtoIMethod,std::default_delete<slang::ast::builtins::StringAtoIMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_a0,
             (unique_ptr<slang::ast::builtins::StringAtoIMethod,_std::default_delete<slang::ast::builtins::StringAtoIMethod>_>
              *)&local_140);
  addSystemMethod(this,StringType,&local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a0.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_140 != (long *)0x0) {
    (**(code **)(*local_140 + 8))();
  }
  local_134[0] = true;
  local_134[1] = true;
  local_134[2] = false;
  local_134[3] = false;
  local_138 = 0x10;
  std::
  make_unique<slang::ast::builtins::StringAtoIMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName,int>
            ((Builtins *)&local_140,(KnownSystemName *)this,(int *)local_134);
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringAtoIMethod,std::default_delete<slang::ast::builtins::StringAtoIMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_b0,
             (unique_ptr<slang::ast::builtins::StringAtoIMethod,_std::default_delete<slang::ast::builtins::StringAtoIMethod>_>
              *)&local_140);
  addSystemMethod(this,StringType,&local_b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b0.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_140 != (long *)0x0) {
    (**(code **)(*local_140 + 8))();
  }
  local_134[0] = true;
  local_134[1] = true;
  local_134[2] = false;
  local_134[3] = false;
  local_138 = 8;
  std::
  make_unique<slang::ast::builtins::StringAtoIMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName,int>
            ((Builtins *)&local_140,(KnownSystemName *)this,(int *)local_134);
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringAtoIMethod,std::default_delete<slang::ast::builtins::StringAtoIMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_c0,
             (unique_ptr<slang::ast::builtins::StringAtoIMethod,_std::default_delete<slang::ast::builtins::StringAtoIMethod>_>
              *)&local_140);
  addSystemMethod(this,StringType,&local_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c0.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_140 != (long *)0x0) {
    (**(code **)(*local_140 + 8))();
  }
  local_134[0] = true;
  local_134[1] = true;
  local_134[2] = false;
  local_134[3] = false;
  local_138 = 2;
  std::
  make_unique<slang::ast::builtins::StringAtoIMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName,int>
            ((Builtins *)&local_140,(KnownSystemName *)this,(int *)local_134);
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringAtoIMethod,std::default_delete<slang::ast::builtins::StringAtoIMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_d0,
             (unique_ptr<slang::ast::builtins::StringAtoIMethod,_std::default_delete<slang::ast::builtins::StringAtoIMethod>_>
              *)&local_140);
  addSystemMethod(this,StringType,&local_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d0.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_140 != (long *)0x0) {
    (**(code **)(*local_140 + 8))();
  }
  std::make_unique<slang::ast::builtins::StringAtoRealMethod,slang::ast::builtins::Builtins&>
            ((Builtins *)&local_140);
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringAtoRealMethod,std::default_delete<slang::ast::builtins::StringAtoRealMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_e0,
             (unique_ptr<slang::ast::builtins::StringAtoRealMethod,_std::default_delete<slang::ast::builtins::StringAtoRealMethod>_>
              *)&local_140);
  addSystemMethod(this,StringType,&local_e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e0.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_140 != (long *)0x0) {
    (**(code **)(*local_140 + 8))();
  }
  local_134[0] = true;
  local_134[1] = true;
  local_134[2] = false;
  local_134[3] = false;
  local_138 = CONCAT31(local_138._1_3_,2);
  std::
  make_unique<slang::ast::builtins::StringItoAMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((Builtins *)&local_140,(KnownSystemName *)this,local_134);
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringItoAMethod,std::default_delete<slang::ast::builtins::StringItoAMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_f0,
             (unique_ptr<slang::ast::builtins::StringItoAMethod,_std::default_delete<slang::ast::builtins::StringItoAMethod>_>
              *)&local_140);
  addSystemMethod(this,StringType,&local_f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_f0.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_140 != (long *)0x0) {
    (**(code **)(*local_140 + 8))();
  }
  local_134[0] = true;
  local_134[1] = true;
  local_134[2] = false;
  local_134[3] = false;
  local_138 = CONCAT31(local_138._1_3_,3);
  std::
  make_unique<slang::ast::builtins::StringItoAMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((Builtins *)&local_140,(KnownSystemName *)this,local_134);
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringItoAMethod,std::default_delete<slang::ast::builtins::StringItoAMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_100,
             (unique_ptr<slang::ast::builtins::StringItoAMethod,_std::default_delete<slang::ast::builtins::StringItoAMethod>_>
              *)&local_140);
  addSystemMethod(this,StringType,&local_100);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_100.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  if (local_140 != (long *)0x0) {
    (**(code **)(*local_140 + 8))();
  }
  local_134[0] = true;
  local_134[1] = true;
  local_134[2] = false;
  local_134[3] = false;
  local_138 = CONCAT31(local_138._1_3_,1);
  std::
  make_unique<slang::ast::builtins::StringItoAMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((Builtins *)&local_140,(KnownSystemName *)this,local_134);
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringItoAMethod,std::default_delete<slang::ast::builtins::StringItoAMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_110,
             (unique_ptr<slang::ast::builtins::StringItoAMethod,_std::default_delete<slang::ast::builtins::StringItoAMethod>_>
              *)&local_140);
  addSystemMethod(this,StringType,&local_110);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_110.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  if (local_140 != (long *)0x0) {
    (**(code **)(*local_140 + 8))();
  }
  local_134[0] = true;
  local_134[1] = true;
  local_134[2] = false;
  local_134[3] = false;
  local_138 = local_138 & 0xffffff00;
  std::
  make_unique<slang::ast::builtins::StringItoAMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((Builtins *)&local_140,(KnownSystemName *)this,local_134);
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringItoAMethod,std::default_delete<slang::ast::builtins::StringItoAMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_120,
             (unique_ptr<slang::ast::builtins::StringItoAMethod,_std::default_delete<slang::ast::builtins::StringItoAMethod>_>
              *)&local_140);
  addSystemMethod(this,StringType,&local_120);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_120.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  if (local_140 != (long *)0x0) {
    (**(code **)(*local_140 + 8))();
  }
  std::make_unique<slang::ast::builtins::StringRealtoAMethod,slang::ast::builtins::Builtins&>
            ((Builtins *)&local_140);
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringRealtoAMethod,std::default_delete<slang::ast::builtins::StringRealtoAMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_130,
             (unique_ptr<slang::ast::builtins::StringRealtoAMethod,_std::default_delete<slang::ast::builtins::StringRealtoAMethod>_>
              *)&local_140);
  addSystemMethod(this,StringType,&local_130);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_130.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  if (local_140 != (long *)0x0) {
    (**(code **)(*local_140 + 8))();
  }
  return;
}

Assistant:

void Builtins::registerStringMethods() {
    using parsing::KnownSystemName;

#define REGISTER(kind, name, ...) addSystemMethod(kind, std::make_unique<name##Method>(__VA_ARGS__))
    REGISTER(SymbolKind::StringType, StringLen, *this);
    REGISTER(SymbolKind::StringType, StringPutc, *this);
    REGISTER(SymbolKind::StringType, StringGetc, *this);
    REGISTER(SymbolKind::StringType, StringUpperLower, *this, KnownSystemName::ToUpper, true);
    REGISTER(SymbolKind::StringType, StringUpperLower, *this, KnownSystemName::ToLower, false);
    REGISTER(SymbolKind::StringType, StringCompare, *this, KnownSystemName::Compare, false);
    REGISTER(SymbolKind::StringType, StringCompare, *this, KnownSystemName::ICompare, true);
    REGISTER(SymbolKind::StringType, StringSubstr, *this);
    REGISTER(SymbolKind::StringType, StringAtoI, *this, KnownSystemName::AToI, 10);
    REGISTER(SymbolKind::StringType, StringAtoI, *this, KnownSystemName::AToHex, 16);
    REGISTER(SymbolKind::StringType, StringAtoI, *this, KnownSystemName::AToOct, 8);
    REGISTER(SymbolKind::StringType, StringAtoI, *this, KnownSystemName::AToBin, 2);
    REGISTER(SymbolKind::StringType, StringAtoReal, *this);
    REGISTER(SymbolKind::StringType, StringItoA, *this, KnownSystemName::IToA,
             LiteralBase::Decimal);
    REGISTER(SymbolKind::StringType, StringItoA, *this, KnownSystemName::HexToA, LiteralBase::Hex);
    REGISTER(SymbolKind::StringType, StringItoA, *this, KnownSystemName::OctToA,
             LiteralBase::Octal);
    REGISTER(SymbolKind::StringType, StringItoA, *this, KnownSystemName::BinToA,
             LiteralBase::Binary);
    REGISTER(SymbolKind::StringType, StringRealtoA, *this);

#undef REGISTER
}